

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MinOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  interval_t *piVar1;
  int64_t iVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  idx_t iVar9;
  ulong uVar10;
  UnifiedVectorFormat idata;
  AggregateUnaryInput local_a0;
  ValidityMask *local_88;
  unsigned_long *local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_88 = &input->validity;
    local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar10 = 0;
      local_80 = (unsigned_long *)count;
      local_78.sel = (SelectionVector *)aggr_input_data;
      local_78.data = (data_ptr_t)local_88;
      do {
        puVar5 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar8 = (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar8 == (unsigned_long *)0x0) {
          uVar7 = 0xffffffffffffffff;
        }
        else {
          uVar7 = puVar8[uVar10];
        }
        puVar8 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8;
        if (local_80 <=
            local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8) {
          puVar8 = local_80;
        }
        puVar6 = puVar8;
        if (uVar7 != 0) {
          if (uVar7 == 0xffffffffffffffff) {
            for (; puVar6 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar8;
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              MinMaxBase::
              Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MinOperation>
                        ((MinMaxState<duckdb::interval_t> *)state,
                         (interval_t *)
                         (pdVar3 + (long)local_78.validity.
                                         super_TemplatedValidityMask<unsigned_long>.validity_mask *
                                   0x10),(AggregateUnaryInput *)&local_78);
            }
          }
          else {
            for (; puVar6 = local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar8;
                local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              if ((uVar7 >> ((ulong)(uint)((int)local_78.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar5) & 0x3f) & 1) != 0) {
                MinMaxBase::
                Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MinOperation>
                          ((MinMaxState<duckdb::interval_t> *)state,
                           (interval_t *)
                           (pdVar3 + (long)local_78.validity.
                                           super_TemplatedValidityMask<unsigned_long>.validity_mask
                                     * 0x10),(AggregateUnaryInput *)&local_78);
              }
            }
          }
        }
        local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        uVar10 = uVar10 + 1;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
      piVar1 = (interval_t *)input->data;
      iVar2 = piVar1->micros;
      if (state[0x10] != '\0') {
        MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                  ((MinMaxState<duckdb::interval_t> *)state,*piVar1,aggr_input_data);
        return;
      }
      *(undefined8 *)state = *(undefined8 *)piVar1;
      *(int64_t *)(state + 8) = iVar2;
      state[0x10] = '\x01';
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    local_a0.input_mask = &local_78.validity;
    local_a0.input_idx = 0;
    local_a0.input = aggr_input_data;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        iVar9 = 0;
        do {
          local_a0.input_idx = iVar9;
          if (psVar4 != (sel_t *)0x0) {
            local_a0.input_idx = (idx_t)psVar4[iVar9];
          }
          MinMaxBase::
          Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MinOperation>
                    ((MinMaxState<duckdb::interval_t> *)state,
                     (interval_t *)(local_78.data + local_a0.input_idx * 0x10),&local_a0);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      iVar9 = 0;
      do {
        local_a0.input_idx = iVar9;
        if (psVar4 != (sel_t *)0x0) {
          local_a0.input_idx = (idx_t)psVar4[iVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_a0.input_idx >> 6] >> (local_a0.input_idx & 0x3f) & 1) != 0)) {
          MinMaxBase::
          Operation<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>,duckdb::MinOperation>
                    ((MinMaxState<duckdb::interval_t> *)state,
                     (interval_t *)(local_78.data + local_a0.input_idx * 0x10),&local_a0);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}